

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

type __thiscall
chrono::ChClassRegistration<chrono::ChFunction_Derive>::_create<chrono::ChFunction_Derive>
          (ChClassRegistration<chrono::ChFunction_Derive> *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)::operator_new(0x20);
  *puVar1 = &PTR__ChFunction_Derive_011905c8;
  puVar1[1] = 0;
  puVar1[2] = 0;
  *(undefined4 *)(puVar1 + 3) = 1;
  return puVar1;
}

Assistant:

typename enable_if< std::is_default_constructible<Tc>::value, void* >::type
    _create() {
        return reinterpret_cast<void*>(new Tc);
    }